

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PClass::BuildFlatPointers(PClass *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t *__dest;
  size_t *flat;
  int numSuperPointers;
  int numPointers;
  PClass *this_local;
  
  if (this->FlatPointers == (size_t *)0x0) {
    if (this->ParentClass == (PClass *)0x0) {
      if (this->Pointers == (size_t *)0x0) {
        this->FlatPointers = &TheEnd;
      }
      else {
        this->FlatPointers = this->Pointers;
      }
    }
    else {
      BuildFlatPointers(this->ParentClass);
      if (this->Pointers == (size_t *)0x0) {
        this->FlatPointers = this->ParentClass->FlatPointers;
      }
      else {
        for (flat._4_4_ = 0; this->Pointers[flat._4_4_] != 0xffffffffffffffff;
            flat._4_4_ = flat._4_4_ + 1) {
        }
        for (flat._0_4_ = 0; this->ParentClass->FlatPointers[(int)flat] != 0xffffffffffffffff;
            flat._0_4_ = (int)flat + 1) {
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(flat._4_4_ + (int)flat + 1);
        uVar2 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar2 = 0xffffffffffffffff;
        }
        __dest = (size_t *)operator_new__(uVar2);
        if (0 < (int)flat) {
          memcpy(__dest,this->ParentClass->FlatPointers,(long)(int)flat << 3);
        }
        memcpy(__dest + (int)flat,this->Pointers,(long)(flat._4_4_ + 1) << 3);
        this->FlatPointers = __dest;
      }
    }
  }
  return;
}

Assistant:

void PClass::BuildFlatPointers ()
{
	if (FlatPointers != NULL)
	{ // Already built: Do nothing.
		return;
	}
	else if (ParentClass == NULL)
	{ // No parent: FlatPointers is the same as Pointers.
		if (Pointers == NULL)
		{ // No pointers: Make FlatPointers a harmless non-NULL.
			FlatPointers = &TheEnd;
		}
		else
		{
			FlatPointers = Pointers;
		}
	}
	else
	{
		ParentClass->BuildFlatPointers ();
		if (Pointers == NULL)
		{ // No new pointers: Just use the same FlatPointers as the parent.
			FlatPointers = ParentClass->FlatPointers;
		}
		else
		{ // New pointers: Create a new FlatPointers array and add them.
			int numPointers, numSuperPointers;

			// Count pointers defined by this class.
			for (numPointers = 0; Pointers[numPointers] != ~(size_t)0; numPointers++)
			{ }
			// Count pointers defined by superclasses.
			for (numSuperPointers = 0; ParentClass->FlatPointers[numSuperPointers] != ~(size_t)0; numSuperPointers++)
			{ }

			// Concatenate them into a new array
			size_t *flat = new size_t[numPointers + numSuperPointers + 1];
			if (numSuperPointers > 0)
			{
				memcpy (flat, ParentClass->FlatPointers, sizeof(size_t)*numSuperPointers);
			}
			memcpy (flat + numSuperPointers, Pointers, sizeof(size_t)*(numPointers+1));
			FlatPointers = flat;
		}
	}
}